

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

bool Jinx::operator==(Variant *left,Variant *right)

{
  bool bVar1;
  bool bVar2;
  ValueType VVar3;
  ValueType VVar4;
  int64_t iVar5;
  int64_t iVar6;
  RuntimeID RVar7;
  RuntimeID RVar8;
  double dVar9;
  double dVar10;
  Guid local_140;
  Guid local_130;
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [40];
  CollectionItrPair local_a8;
  undefined1 local_90 [16];
  undefined1 local_80 [64];
  String local_40;
  Variant *local_20;
  Variant *right_local;
  Variant *left_local;
  
  local_20 = right;
  right_local = left;
  VVar3 = Variant::GetType(left);
  switch(VVar3) {
  case Null:
    left_local._7_1_ = Variant::IsNull(local_20);
    break;
  case Number:
    dVar9 = Variant::GetNumber(right_local);
    dVar10 = Variant::GetNumber(local_20);
    left_local._7_1_ = dVar9 == dVar10;
    break;
  case Integer:
    bVar2 = Variant::IsNumericType(local_20);
    if (bVar2) {
      bVar2 = Variant::IsNumber(local_20);
      if (bVar2) {
        dVar9 = Variant::GetNumber(right_local);
        dVar10 = Variant::GetNumber(local_20);
        left_local._7_1_ = dVar9 == dVar10;
      }
      else {
        iVar5 = Variant::GetInteger(right_local);
        iVar6 = Variant::GetInteger(local_20);
        left_local._7_1_ = iVar5 == iVar6;
      }
    }
    else {
      left_local._7_1_ = 0;
    }
    break;
  case Boolean:
    bVar2 = Variant::IsBoolean(local_20);
    if (bVar2) {
      bVar2 = Variant::GetBoolean(right_local);
      bVar1 = Variant::GetBoolean(local_20);
      left_local._7_1_ = bVar2 == bVar1;
    }
    else {
      left_local._7_1_ = 0;
    }
    break;
  case String:
    bVar2 = Variant::IsString(local_20);
    if (bVar2) {
      Variant::GetString_abi_cxx11_(&local_40,right_local);
      Variant::GetString_abi_cxx11_((String *)(local_80 + 0x20),local_20);
      left_local._7_1_ =
           std::operator==(&local_40,
                           (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                           (local_80 + 0x20));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                    (local_80 + 0x20));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&local_40);
    }
    else {
      left_local._7_1_ = 0;
    }
    break;
  case Collection:
    bVar2 = Variant::IsCollection(local_20);
    if (bVar2) {
      Variant::GetCollection((Variant *)local_80);
      Variant::GetCollection((Variant *)local_90);
      left_local._7_1_ =
           std::operator==((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                            *)local_80,
                           (shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                            *)local_90);
      std::
      shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
      ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                     *)local_90);
      std::
      shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
      ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                     *)local_80);
    }
    else {
      left_local._7_1_ = 0;
    }
    break;
  case CollectionItr:
    bVar2 = Variant::IsCollectionItr(local_20);
    if (bVar2) {
      Variant::GetCollectionItr(&local_a8,right_local);
      Variant::GetCollectionItr((CollectionItrPair *)(local_d0 + 0x10),local_20);
      left_local._7_1_ =
           std::operator==(&local_a8,
                           (pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
                            *)(local_d0 + 0x10));
      std::
      pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
      ::~pair((pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
               *)(local_d0 + 0x10));
      std::
      pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
      ::~pair(&local_a8);
    }
    else {
      left_local._7_1_ = 0;
    }
    break;
  case Function:
    bVar2 = Variant::IsFunction(local_20);
    if (bVar2) {
      RVar7 = Variant::GetFunction(right_local);
      RVar8 = Variant::GetFunction(local_20);
      left_local._7_1_ = RVar7 == RVar8;
    }
    else {
      left_local._7_1_ = 0;
    }
    break;
  case Coroutine:
    bVar2 = Variant::IsCoroutine(local_20);
    if (bVar2) {
      Variant::GetCoroutine((Variant *)local_d0);
      Variant::GetCoroutine((Variant *)local_e0);
      left_local._7_1_ =
           std::operator==((shared_ptr<Jinx::ICoroutine> *)local_d0,
                           (shared_ptr<Jinx::ICoroutine> *)local_e0);
      std::shared_ptr<Jinx::ICoroutine>::~shared_ptr((shared_ptr<Jinx::ICoroutine> *)local_e0);
      std::shared_ptr<Jinx::ICoroutine>::~shared_ptr((shared_ptr<Jinx::ICoroutine> *)local_d0);
    }
    else {
      left_local._7_1_ = 0;
    }
    break;
  case UserObject:
    bVar2 = Variant::IsUserObject(local_20);
    if (bVar2) {
      Variant::GetUserObject((Variant *)local_f0);
      Variant::GetUserObject((Variant *)local_100);
      left_local._7_1_ =
           std::operator==((shared_ptr<Jinx::IUserObject> *)local_f0,
                           (shared_ptr<Jinx::IUserObject> *)local_100);
      std::shared_ptr<Jinx::IUserObject>::~shared_ptr((shared_ptr<Jinx::IUserObject> *)local_100);
      std::shared_ptr<Jinx::IUserObject>::~shared_ptr((shared_ptr<Jinx::IUserObject> *)local_f0);
    }
    else {
      left_local._7_1_ = 0;
    }
    break;
  case Buffer:
    bVar2 = Variant::IsBuffer(local_20);
    if (bVar2) {
      Variant::GetBuffer((Variant *)local_110);
      Variant::GetBuffer((Variant *)local_120);
      left_local._7_1_ =
           std::operator==((shared_ptr<Jinx::Buffer> *)local_110,
                           (shared_ptr<Jinx::Buffer> *)local_120);
      std::shared_ptr<Jinx::Buffer>::~shared_ptr((shared_ptr<Jinx::Buffer> *)local_120);
      std::shared_ptr<Jinx::Buffer>::~shared_ptr((shared_ptr<Jinx::Buffer> *)local_110);
    }
    else {
      left_local._7_1_ = 0;
    }
    break;
  case Guid:
    bVar2 = Variant::IsGuid(local_20);
    if (bVar2) {
      local_130 = Variant::GetGuid(right_local);
      local_140 = Variant::GetGuid(local_20);
      left_local._7_1_ = operator==(&local_130,&local_140);
    }
    else {
      left_local._7_1_ = 0;
    }
    break;
  case ValType:
    bVar2 = Variant::IsValType(local_20);
    if (bVar2) {
      VVar3 = Variant::GetValType(right_local);
      VVar4 = Variant::GetValType(local_20);
      left_local._7_1_ = VVar3 == VVar4;
    }
    else {
      left_local._7_1_ = 0;
    }
    break;
  default:
    __assert_fail("!\"Unknown variant type!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxVariant.cpp"
                  ,0x417,"bool Jinx::operator==(const Variant &, const Variant &)");
  }
  return (bool)(left_local._7_1_ & 1);
}

Assistant:

inline_t bool operator == (const Variant & left, const Variant & right)
	{
		switch (left.GetType())
		{
			case ValueType::Null:
			{
				return right.IsNull();
			}
			case ValueType::Number:
			{
				return left.GetNumber() == right.GetNumber();
			}
			case ValueType::Integer:
			{
				if (!right.IsNumericType())
					return false;
				if (right.IsNumber())
					return left.GetNumber() == right.GetNumber();
				else
					return left.GetInteger() == right.GetInteger();
			}
			case ValueType::Boolean:
			{
				if (!right.IsBoolean())
					return false;
				return left.GetBoolean() == right.GetBoolean();
			}
			case ValueType::String:
			{
				if (!right.IsString())
					return false;
				return left.GetString() == right.GetString();
			}
			case ValueType::Collection:
			{
				if (!right.IsCollection())
					return false;
				return left.GetCollection() == right.GetCollection();
			}
			case ValueType::CollectionItr:
			{
				if (!right.IsCollectionItr())
					return false;
				return left.GetCollectionItr() == right.GetCollectionItr();
			}
			case ValueType::Function:
			{
				if (!right.IsFunction())
					return false;
				return left.GetFunction() == right.GetFunction();
			}
			case ValueType::Coroutine:
			{
				if (!right.IsCoroutine())
					return false;
				return left.GetCoroutine() == right.GetCoroutine();
			}
			case ValueType::UserObject:
			{
				if (!right.IsUserObject())
					return false;
				return left.GetUserObject() == right.GetUserObject();
			}
			case ValueType::Buffer:
			{
				if (!right.IsBuffer())
					return false;
				return left.GetBuffer() == right.GetBuffer();
			}
			case ValueType::Guid:
			{
				if (!right.IsGuid())
					return false;
				return left.GetGuid() == right.GetGuid();
			}
			case ValueType::ValType:
			{
				if (!right.IsValType())
					return false;
				return left.GetValType() == right.GetValType();
			}
			default:
			{
				assert(!"Unknown variant type!");
			}
		};

		return false;
	}